

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.hpp
# Opt level: O0

void __thiscall OpenMD::ReplacementVisitor::~ReplacementVisitor(ReplacementVisitor *this)

{
  ReplacementVisitor *in_RDI;
  
  ~ReplacementVisitor(in_RDI);
  operator_delete(in_RDI,0x78);
  return;
}

Assistant:

ReplacementVisitor(SimInfo* info) : BaseAtomVisitor(info) {
      visitorName = "ReplacementVisitor";
      sites_      = std::make_shared<AtomData>();
    }